

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

string * __thiscall
deqp::gles2::Performance::textureLookupVertexTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,ConditionalUsage conditionalUsage,
          ConditionalType conditionalType)

{
  string *psVar1;
  bool bVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar2 = (int)this != 0;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (bVar2 && conditionalUsage == CONDITIONAL_USAGE_EVERY_OTHER) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (bVar2 && conditionalUsage == CONDITIONAL_USAGE_EVERY_OTHER) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  psVar1 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar1;
}

Assistant:

static string textureLookupVertexTemplate (ConditionalUsage conditionalUsage, ConditionalType conditionalType)
{
	string	resultTemplate;
	bool	conditionVaryingNeeded = conditionalUsage != CONDITIONAL_USAGE_NONE && conditionalType == CONDITIONAL_TYPE_DYNAMIC;

	resultTemplate +=
		"attribute highp vec4 a_position${NAME_SPEC};\n"
		"attribute mediump vec2 a_coords${NAME_SPEC};\n"
		"varying mediump vec2 v_coords${NAME_SPEC};\n";

	if (conditionVaryingNeeded)
		resultTemplate +=
			"attribute mediump float a_condition${NAME_SPEC};\n"
			"varying mediump float v_condition${NAME_SPEC};\n";

	resultTemplate +=
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n"
		"	v_coords${NAME_SPEC} = a_coords${NAME_SPEC};\n";

	if (conditionVaryingNeeded)
		resultTemplate +=
			"	v_condition${NAME_SPEC} = a_condition${NAME_SPEC};\n";

	resultTemplate +=
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}